

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::DescriptorProto_ExtensionRange::SharedDtor(MessageLite *self)

{
  ExtensionRangeOptions *this;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  DescriptorProto_ExtensionRange *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (DescriptorProto_ExtensionRange *)self;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  pAVar1 = MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    this = (ExtensionRangeOptions *)local_18[1]._internal_metadata_.ptr_;
    if (this != (ExtensionRangeOptions *)0x0) {
      ExtensionRangeOptions::~ExtensionRangeOptions(this);
      operator_delete(this,0x70);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0xd03,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void DescriptorProto_ExtensionRange::SharedDtor(MessageLite& self) {
  DescriptorProto_ExtensionRange& this_ = static_cast<DescriptorProto_ExtensionRange&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.options_;
  this_._impl_.~Impl_();
}